

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int file_list(int pi,char *fpat,char *buf,uint count)

{
  size_t sVar1;
  undefined4 in_ECX;
  int in_EDX;
  char *in_RSI;
  gpioExtent_t ext [1];
  int bytes;
  int len;
  int in_stack_00000fb0;
  int in_stack_00000fb4;
  void *in_stack_00000fb8;
  int in_stack_00000fc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined4 local_24;
  
  sVar1 = strlen(in_RSI);
  local_24 = pigpio_command_ext(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                                in_stack_ffffffffffffffc8,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                (int)sVar1 >> 0x1f,(gpioExtent_t *)CONCAT44(in_ECX,(int)sVar1),
                                in_EDX);
  if (0 < local_24) {
    local_24 = recvMax(in_stack_00000fc4,in_stack_00000fb8,in_stack_00000fb4,in_stack_00000fb0);
  }
  _pmu(0);
  return local_24;
}

Assistant:

int file_list(int pi, char *fpat,  char *buf, unsigned count)
{
   int len;
   int bytes;
   gpioExtent_t ext[1];

   len = strlen(fpat);

   /*
   p1=60000
   p2=0
   p3=len
   ## extension ##
   char fpat[len]
   */

   ext[0].size = len;
   ext[0].ptr = fpat;

   bytes = pigpio_command_ext(pi, PI_CMD_FL, 60000, 0, len, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, count, bytes);
   }

   _pmu(pi);

   return bytes;
}